

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool ModulusSimpleCaseHelper<unsigned_long_long,_unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
     ::ModulusSimpleCase(unsigned_long lhs,
                        SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        rhs,SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
                            *result)

{
  bool bVar1;
  unsigned_long_long uVar2;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *in_RDX;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> in_RSI;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *in_RDI;
  int in_stack_ffffffffffffffbc;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
  in_stack_ffffffffffffffc0;
  
  bVar1 = ::operator!=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  if (bVar1) {
    bVar1 = ModulusSignedCaseHelper<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
            ::SignedCase(in_RSI,in_RDX);
    if (!bVar1) {
      uVar2 = ::SafeInt::operator_cast_to_unsigned_long_long(in_RDI);
      SafeInt<unsigned_long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
                  *)in_RSI.m_int,(unsigned_long_long *)((ulong)in_RDI % uVar2));
    }
    return true;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
}

Assistant:

static bool ModulusSimpleCase( U lhs, SafeInt< T, E > rhs, SafeInt< T, E >& result ) SAFEINT_CPP_THROW
    {
        if( rhs != 0 )
        {
            if( ModulusSignedCaseHelper< T, E, std::numeric_limits< T >::is_signed >::SignedCase( rhs, result ) )
            return true;

            result = (T)( lhs % (T)rhs );
            return true;
        }

        E::SafeIntOnDivZero();
    }